

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519_64.h
# Opt level: O0

void fiat_25519_carry_square(uint64_t *out1,uint64_t *arg1)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  uint64_t x50;
  uint64_t x49;
  fiat_25519_uint1 x48;
  uint64_t x47;
  uint64_t x46;
  uint64_t x45;
  uint64_t x44;
  uint64_t x43;
  uint64_t x42;
  uint64_t x41;
  fiat_25519_uint128 x40;
  uint64_t x39;
  uint64_t x38;
  fiat_25519_uint128 x37;
  uint64_t x36;
  uint64_t x35;
  fiat_25519_uint128 x34;
  uint64_t x33;
  uint64_t x32;
  fiat_25519_uint128 x31;
  fiat_25519_uint128 x30;
  fiat_25519_uint128 x29;
  fiat_25519_uint128 x28;
  fiat_25519_uint128 x27;
  uint64_t x26;
  uint64_t x25;
  fiat_25519_uint128 x24;
  fiat_25519_uint128 x23;
  fiat_25519_uint128 x22;
  fiat_25519_uint128 x21;
  fiat_25519_uint128 x20;
  fiat_25519_uint128 x19;
  fiat_25519_uint128 x18;
  fiat_25519_uint128 x17;
  fiat_25519_uint128 x16;
  fiat_25519_uint128 x15;
  fiat_25519_uint128 x14;
  fiat_25519_uint128 x13;
  fiat_25519_uint128 x12;
  fiat_25519_uint128 x11;
  fiat_25519_uint128 x10;
  fiat_25519_uint128 x9;
  uint64_t x8;
  uint64_t x7;
  uint64_t x6;
  uint64_t x5;
  uint64_t x4;
  uint64_t x3;
  uint64_t x2;
  uint64_t x1;
  uint64_t *arg1_local;
  uint64_t *out1_local;
  
  uVar35 = arg1[4] * 0x26;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = arg1[4];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = arg1[4] * 0x13;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = arg1[3];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar35;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = arg1[3];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = arg1[3] * 0x13;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = arg1[2];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar35;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = arg1[2];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = arg1[3] * 0x26;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = arg1[2];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = arg1[2];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = arg1[1];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar35;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = arg1[1];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = arg1[3] * 2;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = arg1[1];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = arg1[2] * 2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = arg1[1];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = arg1[1];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *arg1;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = arg1[4] * 2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *arg1;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = arg1[3] * 2;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *arg1;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = arg1[2] * 2;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *arg1;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = arg1[1] * 2;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *arg1;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *arg1;
  auVar5 = auVar15 * auVar30 + auVar7 * auVar22 + auVar5 * auVar20;
  uVar35 = auVar5._0_8_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = auVar5._8_8_ << 0xd | uVar35 >> 0x33;
  auVar34 = auVar14 * auVar29 + auVar4 * auVar19 + auVar3 * auVar18 + auVar34;
  uVar36 = auVar34._0_8_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = auVar34._8_8_ * 0x2000 | uVar36 >> 0x33;
  auVar33 = auVar13 * auVar28 + auVar10 * auVar25 + auVar2 * auVar17 + auVar33;
  uVar37 = auVar33._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = auVar33._8_8_ * 0x2000 | uVar37 >> 0x33;
  auVar32 = auVar12 * auVar27 + auVar9 * auVar24 + auVar1 * auVar16 + auVar32;
  uVar38 = auVar32._0_8_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = auVar32._8_8_ * 0x2000 | uVar38 >> 0x33;
  auVar31 = auVar11 * auVar26 + auVar8 * auVar23 + auVar6 * auVar21 + auVar31;
  uVar39 = auVar31._0_8_;
  uVar35 = (uVar35 & 0x7ffffffffffff) + (auVar31._8_8_ * 0x2000 | uVar39 >> 0x33) * 0x13;
  uVar36 = (uVar35 >> 0x33) + (uVar36 & 0x7ffffffffffff);
  *out1 = uVar35 & 0x7ffffffffffff;
  out1[1] = uVar36 & 0x7ffffffffffff;
  out1[2] = (uVar36 >> 0x33) + (uVar37 & 0x7ffffffffffff);
  out1[3] = uVar38 & 0x7ffffffffffff;
  out1[4] = uVar39 & 0x7ffffffffffff;
  return;
}

Assistant:

static FIAT_25519_FIAT_INLINE void fiat_25519_carry_square(fiat_25519_tight_field_element out1, const fiat_25519_loose_field_element arg1) {
  uint64_t x1;
  uint64_t x2;
  uint64_t x3;
  uint64_t x4;
  uint64_t x5;
  uint64_t x6;
  uint64_t x7;
  uint64_t x8;
  fiat_25519_uint128 x9;
  fiat_25519_uint128 x10;
  fiat_25519_uint128 x11;
  fiat_25519_uint128 x12;
  fiat_25519_uint128 x13;
  fiat_25519_uint128 x14;
  fiat_25519_uint128 x15;
  fiat_25519_uint128 x16;
  fiat_25519_uint128 x17;
  fiat_25519_uint128 x18;
  fiat_25519_uint128 x19;
  fiat_25519_uint128 x20;
  fiat_25519_uint128 x21;
  fiat_25519_uint128 x22;
  fiat_25519_uint128 x23;
  fiat_25519_uint128 x24;
  uint64_t x25;
  uint64_t x26;
  fiat_25519_uint128 x27;
  fiat_25519_uint128 x28;
  fiat_25519_uint128 x29;
  fiat_25519_uint128 x30;
  fiat_25519_uint128 x31;
  uint64_t x32;
  uint64_t x33;
  fiat_25519_uint128 x34;
  uint64_t x35;
  uint64_t x36;
  fiat_25519_uint128 x37;
  uint64_t x38;
  uint64_t x39;
  fiat_25519_uint128 x40;
  uint64_t x41;
  uint64_t x42;
  uint64_t x43;
  uint64_t x44;
  uint64_t x45;
  uint64_t x46;
  uint64_t x47;
  fiat_25519_uint1 x48;
  uint64_t x49;
  uint64_t x50;
  x1 = ((arg1[4]) * UINT8_C(0x13));
  x2 = (x1 * 0x2);
  x3 = ((arg1[4]) * 0x2);
  x4 = ((arg1[3]) * UINT8_C(0x13));
  x5 = (x4 * 0x2);
  x6 = ((arg1[3]) * 0x2);
  x7 = ((arg1[2]) * 0x2);
  x8 = ((arg1[1]) * 0x2);
  x9 = ((fiat_25519_uint128)(arg1[4]) * x1);
  x10 = ((fiat_25519_uint128)(arg1[3]) * x2);
  x11 = ((fiat_25519_uint128)(arg1[3]) * x4);
  x12 = ((fiat_25519_uint128)(arg1[2]) * x2);
  x13 = ((fiat_25519_uint128)(arg1[2]) * x5);
  x14 = ((fiat_25519_uint128)(arg1[2]) * (arg1[2]));
  x15 = ((fiat_25519_uint128)(arg1[1]) * x2);
  x16 = ((fiat_25519_uint128)(arg1[1]) * x6);
  x17 = ((fiat_25519_uint128)(arg1[1]) * x7);
  x18 = ((fiat_25519_uint128)(arg1[1]) * (arg1[1]));
  x19 = ((fiat_25519_uint128)(arg1[0]) * x3);
  x20 = ((fiat_25519_uint128)(arg1[0]) * x6);
  x21 = ((fiat_25519_uint128)(arg1[0]) * x7);
  x22 = ((fiat_25519_uint128)(arg1[0]) * x8);
  x23 = ((fiat_25519_uint128)(arg1[0]) * (arg1[0]));
  x24 = (x23 + (x15 + x13));
  x25 = (uint64_t)(x24 >> 51);
  x26 = (uint64_t)(x24 & UINT64_C(0x7ffffffffffff));
  x27 = (x19 + (x16 + x14));
  x28 = (x20 + (x17 + x9));
  x29 = (x21 + (x18 + x10));
  x30 = (x22 + (x12 + x11));
  x31 = (x25 + x30);
  x32 = (uint64_t)(x31 >> 51);
  x33 = (uint64_t)(x31 & UINT64_C(0x7ffffffffffff));
  x34 = (x32 + x29);
  x35 = (uint64_t)(x34 >> 51);
  x36 = (uint64_t)(x34 & UINT64_C(0x7ffffffffffff));
  x37 = (x35 + x28);
  x38 = (uint64_t)(x37 >> 51);
  x39 = (uint64_t)(x37 & UINT64_C(0x7ffffffffffff));
  x40 = (x38 + x27);
  x41 = (uint64_t)(x40 >> 51);
  x42 = (uint64_t)(x40 & UINT64_C(0x7ffffffffffff));
  x43 = (x41 * UINT8_C(0x13));
  x44 = (x26 + x43);
  x45 = (x44 >> 51);
  x46 = (x44 & UINT64_C(0x7ffffffffffff));
  x47 = (x45 + x33);
  x48 = (fiat_25519_uint1)(x47 >> 51);
  x49 = (x47 & UINT64_C(0x7ffffffffffff));
  x50 = (x48 + x36);
  out1[0] = x46;
  out1[1] = x49;
  out1[2] = x50;
  out1[3] = x39;
  out1[4] = x42;
}